

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

void __thiscall QDataStream::setByteOrder(QDataStream *this,ByteOrder bo)

{
  ByteOrder bo_local;
  QDataStream *this_local;
  
  this->byteorder = bo;
  this->noswap = bo == LittleEndian;
  return;
}

Assistant:

void QDataStream::setByteOrder(ByteOrder bo)
{
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
    // accessed by inline byteOrder() prior to Qt 6.8
    byteorder = bo;
#endif
    if (QSysInfo::ByteOrder == QSysInfo::BigEndian)
        noswap = (bo == BigEndian);
    else
        noswap = (bo == LittleEndian);
}